

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool __thiscall
re2::PCRE::DoMatch(PCRE *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int vecsize_00;
  ulong uVar3;
  int *vec_00;
  bool b;
  int *vec;
  int vecsize;
  int n_local;
  Arg **args_local;
  int *consumed_local;
  Anchor anchor_local;
  StringPiece *text_local;
  PCRE *this_local;
  
  if (-1 < n) {
    vecsize_00 = (n + 1) * 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)vecsize_00;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    vec_00 = (int *)operator_new__(uVar3);
    bVar2 = DoMatchImpl(this,text,anchor,consumed,args,n,vec_00,vecsize_00);
    if (vec_00 != (int *)0x0) {
      operator_delete__(vec_00);
    }
    return bVar2;
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                0x27b,
                "bool re2::PCRE::DoMatch(const StringPiece &, Anchor, int *, const Arg *const *, int) const"
               );
}

Assistant:

bool PCRE::DoMatch(const StringPiece& text,
                 Anchor anchor,
                 int* consumed,
                 const Arg* const args[],
                 int n) const {
  assert(n >= 0);
  const int vecsize = (1 + n) * 3;  // results + PCRE workspace
                                    // (as for kVecSize)
  int* vec = new int[vecsize];
  bool b = DoMatchImpl(text, anchor, consumed, args, n, vec, vecsize);
  delete[] vec;
  return b;
}